

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Barcode.cpp
# Opt level: O2

string * __thiscall ZXing::Result::ecLevel_abi_cxx11_(string *__return_storage_ptr__,Result *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,this->_ecLevel,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string Result::ecLevel() const
{
	return _ecLevel;
}